

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O3

void __thiscall
rudp::rudp_server::rudp_server
          (rudp_server *this,io_service *ios,uint16_t p,
          function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
          *cb_)

{
  _Rb_tree_header *p_Var1;
  data_union local_44;
  
  this->io_service = ios;
  this->port = p;
  local_44.v6.sin6_scope_id = 0;
  local_44.v4.sin_port = p << 8 | p >> 8;
  local_44.base.sa_data[6] = '\0';
  local_44.base.sa_data[7] = '\0';
  local_44.base.sa_data[8] = '\0';
  local_44.base.sa_data[9] = '\0';
  local_44.base.sa_data[10] = '\0';
  local_44.base.sa_data[0xb] = '\0';
  local_44.base.sa_data[0xc] = '\0';
  local_44.base.sa_data[0xd] = '\0';
  local_44._16_8_ = 0;
  local_44.base.sa_family = 2;
  local_44.v6.sin6_flowinfo = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            (&(this->socket).
              super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,ios,(endpoint_type *)&local_44.base,(type *)0x0);
  std::
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  ::function(&this->cb,cb_);
  p_Var1 = &(this->sessions)._M_t._M_impl.super__Rb_tree_header;
  (this->sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->sessions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->session_bindings)._M_t._M_impl.super__Rb_tree_header;
  (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  receive(this);
  return;
}

Assistant:

rudp_server( boost::asio::io_service &ios, uint16_t p, const std::function< void( rudp_server&, uint32_t, const buffers_ptr_t& ) > &cb_ ) : io_service( ios ), socket( ios, boost::asio::ip::udp::endpoint( boost::asio::ip::udp::v4(), p ) ), port( p ), cb( cb_ ) {
    receive();
  }